

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O2

uint64_t compute_cut_hash(HighsInt *Rindex,double *Rvalue,double maxabscoef,HighsInt Rlen)

{
  u32 uVar1;
  u64 uVar2;
  u64 uVar3;
  size_type __n;
  ulong uVar4;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valueHashCodes;
  allocator_type local_49;
  double local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  __n = (size_type)Rlen;
  local_48 = maxabscoef;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,__n,&local_49);
  local_48 = 1.0 / local_48;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < Rlen) {
    uVar5 = (ulong)(uint)Rlen;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = HighsHashHelpers::double_hash_code(Rvalue[uVar4] * local_48);
    local_40._M_impl.super__Vector_impl_data._M_start[uVar4] = uVar1;
  }
  uVar2 = HighsHashHelpers::vector_hash<int,_0>(Rindex,__n);
  uVar3 = HighsHashHelpers::vector_hash<unsigned_int,_0>
                    (local_40._M_impl.super__Vector_impl_data._M_start,__n);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return uVar3 >> 0x20 ^ uVar2;
}

Assistant:

static uint64_t compute_cut_hash(const HighsInt* Rindex, const double* Rvalue,
                                 double maxabscoef, const HighsInt Rlen) {
  std::vector<uint32_t> valueHashCodes(Rlen);

  double scale = 1.0 / maxabscoef;
  for (HighsInt i = 0; i < Rlen; ++i)
    valueHashCodes[i] = HighsHashHelpers::double_hash_code(scale * Rvalue[i]);

  return HighsHashHelpers::vector_hash(Rindex, Rlen) ^
         (HighsHashHelpers::vector_hash(valueHashCodes.data(), Rlen) >> 32);
}